

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadGeometry(OgreXmlSerializer *this,VertexDataXml *dest)

{
  uint32_t uVar1;
  int iVar2;
  Logger *this_00;
  char *local_1b8;
  char local_1a8 [16];
  undefined1 local_198 [376];
  
  uVar1 = ReadAttribute<unsigned_int>(this,"vertexcount");
  (dest->super_IVertexData).count = uVar1;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[25]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [25])"  - Reading geometry of ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," vertices",9);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  NextNode_abi_cxx11_(this);
  iVar2 = std::__cxx11::string::compare((char *)&this->m_currentNodeName);
  while (iVar2 == 0) {
    ReadGeometryVertexBuffer(this,dest);
    iVar2 = std::__cxx11::string::compare((char *)&this->m_currentNodeName);
  }
  return;
}

Assistant:

void OgreXmlSerializer::ReadGeometry(VertexDataXml *dest)
{
    dest->count = ReadAttribute<uint32_t>("vertexcount");
    ASSIMP_LOG_DEBUG_F( "  - Reading geometry of ", dest->count, " vertices");

    NextNode();
    while(m_currentNodeName == nnVertexBuffer) {
        ReadGeometryVertexBuffer(dest);
    }
}